

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnSurfaceProjection.h
# Opt level: O1

ParameterPoint * __thiscall
anurbs::PointOnSurfaceProjection<3L>::triangle_projection
          (ParameterPoint *__return_storage_ptr__,PointOnSurfaceProjection<3L> *this,Vector *point,
          size_t *index_a,size_t *index_b,size_t *index_c)

{
  size_t sVar1;
  pointer pPVar2;
  size_t sVar3;
  size_t sVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  sVar1 = *index_a;
  pPVar2 = (this->m_tessellation).
           super__Vector_base<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint,_std::allocator<anurbs::PointOnSurfaceProjection<3L>::ParameterPoint>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar5 = *(double *)
           &pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage;
  dVar6 = pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[1];
  dVar14 = pPVar2[sVar1].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[2];
  sVar3 = *index_b;
  sVar4 = *index_c;
  dVar16 = *(double *)
            &pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
             m_storage - dVar5;
  dVar17 = pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[1] - dVar6;
  dVar15 = pPVar2[sVar3].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
           m_storage.m_data.array[2] - dVar14;
  dVar7 = *(double *)
           &pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
            m_storage - dVar5;
  dVar8 = pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[1] - dVar6;
  dVar9 = pPVar2[sVar4].point.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
          .m_data.array[2] - dVar14;
  dVar10 = dVar17 * dVar9 - dVar8 * dVar15;
  dVar11 = dVar15 * dVar7 - dVar9 * dVar16;
  dVar12 = dVar16 * dVar8 - dVar7 * dVar17;
  dVar5 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[0] - dVar5;
  dVar6 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
          array[1] - dVar6;
  dVar14 = (point->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.m_data.
           array[2] - dVar14;
  dVar13 = dVar12 * dVar12 + dVar11 * dVar11 + dVar10 * dVar10;
  dVar15 = ((dVar16 * dVar6 - dVar5 * dVar17) * dVar12 +
           (dVar15 * dVar5 - dVar14 * dVar16) * dVar11 + (dVar17 * dVar14 - dVar6 * dVar15) * dVar10
           ) / dVar13;
  dVar13 = ((dVar5 * dVar8 - dVar6 * dVar7) * dVar12 +
           (dVar14 * dVar7 - dVar9 * dVar5) * dVar11 + (dVar6 * dVar9 - dVar8 * dVar14) * dVar10) /
           dVar13;
  dVar14 = (1.0 - dVar15) - dVar13;
  dVar5 = pPVar2[sVar4].parameter_u * dVar15 +
          pPVar2[sVar1].parameter_u * dVar14 + pPVar2[sVar3].parameter_u * dVar13;
  dVar14 = dVar15 * pPVar2[sVar4].parameter_v +
           dVar14 * pPVar2[sVar1].parameter_v + dVar13 * pPVar2[sVar3].parameter_v;
  (*((this->m_surface).super___shared_ptr<anurbs::SurfaceBase<3L>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_SurfaceBase[6])(dVar5,dVar14,&__return_storage_ptr__->point);
  __return_storage_ptr__->parameter_u = dVar5;
  __return_storage_ptr__->parameter_v = dVar14;
  return __return_storage_ptr__;
}

Assistant:

ParameterPoint triangle_projection(const Vector point,
        const size_t& index_a, const size_t& index_b, const size_t& index_c)
    {
        const auto a = m_tessellation[index_a];
        const auto b = m_tessellation[index_b];
        const auto c = m_tessellation[index_c];

        const Vector u = b.point - a.point;
        const Vector v = c.point - a.point;
        const Vector n = cross(u, v);
        const Vector w = point - a.point;

        const double gam = dot(cross(u, w), n) / squared_norm(n);
        const double bet = dot(cross(w, v), n) / squared_norm(n);
        const double alp = 1.0 - gam - bet;

        const double parameter_u = alp * a.parameter_u + bet * b.parameter_u +
            gam * c.parameter_u;
        const double parameter_v = alp * a.parameter_v + bet * b.parameter_v +
            gam * c.parameter_v;

        const Vector closest_point =
            m_surface->point_at(parameter_u, parameter_v);

        return {parameter_u, parameter_v, closest_point};
    }